

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O3

void printNodes(vector<TSNode,_std::allocator<TSNode>_> *nodes)

{
  undefined8 *puVar1;
  TSNode *pTVar2;
  pointer paVar3;
  TSNode self;
  char *pcVar4;
  size_t sVar5;
  TSNode *pTVar6;
  long lVar7;
  long lVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Nodes at cursor: ",0x11)
  ;
  pTVar6 = (TSNode *)
           (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (TSNode *)
           (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar6 == pTVar2) {
    pcVar4 = "No nodes at cursor\n";
    lVar7 = 0x13;
  }
  else {
    lVar8 = (long)pTVar2 - (long)pTVar6 >> 5;
    lVar7 = lVar8 + -1;
    if (lVar7 != 0) {
      lVar8 = lVar8 << 5;
      do {
        paVar3 = (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)paVar3[-1].context + lVar8 + 0x10);
        self.id = (void *)*puVar1;
        self.context = (uint32_t  [4])*(undefined1 (*) [16])((long)paVar3[-1].context + lVar8);
        self.tree = (TSTree *)puVar1[1];
        pcVar4 = ts_node_type(self);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x21e510);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," -> ",4);
        lVar7 = lVar7 + -1;
        lVar8 = lVar8 + -0x20;
      } while (lVar7 != 0);
      pTVar6 = (TSNode *)
               (nodes->super__Vector_base<TSNode,_std::allocator<TSNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pcVar4 = ts_node_type(*pTVar6);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x21e510);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    pcVar4 = "\n";
    lVar7 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar7);
  return;
}

Assistant:

void printNodes (vector<TSNode> &nodes) {
    std::cerr << "Nodes at cursor: ";

    if (nodes.empty()) {
        std::cerr << "No nodes at cursor\n";
        return;
    }

    for (auto i = nodes.size() - 1; i > 0; i--) {
        std::cerr << ts_node_type(nodes[i]) << " -> ";
    }

    std::cerr << ts_node_type(nodes[0]) << "\n";
}